

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.h
# Opt level: O0

AggregateMarking * __thiscall
KDIS::DATA_TYPE::AggregateMarking::operator=(AggregateMarking *this,AggregateMarking *param_1)

{
  AggregateMarking *param_1_local;
  AggregateMarking *this_local;
  
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  memcpy(&this->m_ui8AggregateMarkingCharacterSet,&param_1->m_ui8AggregateMarkingCharacterSet,0x21);
  return this;
}

Assistant:

class KDIS_EXPORT AggregateMarking : public DataTypeBase
{
protected:

    KUINT8 m_ui8AggregateMarkingCharacterSet;

    KCHAR8 m_sAggregateMarkingString[32]; // Extra octet for terminator, not included in size

public:

    static const KUINT16 AGGREGATE_MARKING_SIZE = 32;

    AggregateMarking();

    explicit AggregateMarking(KDataStream &stream) noexcept(false);

    AggregateMarking(KDIS::DATA_TYPE::ENUMS::EntityMarkingCharacterSet MarkingCharSet, const KCHAR8 *MarkingText,
                     KUINT16 TextSize) noexcept(false);

    ~AggregateMarking() override = default;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateMarking::SetAggregateMarkingCharacterSet
    //              KDIS::DATA_TYPE::AggregateMarking::GetAggregateMarkingCharacterSet
    // Description: Marking Char set
    // Parameter:   AggregateMarkingCharacterSet EMCS, void
    //************************************
    void SetAggregateMarkingCharacterSet( KDIS::DATA_TYPE::ENUMS::EntityMarkingCharacterSet EMCS );
    KDIS::DATA_TYPE::ENUMS::EntityMarkingCharacterSet GetAggregateMarkingCharacterSet() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateMarking::SetAggregateMarkingString
    //              KDIS::DATA_TYPE::AggregateMarking::GetAggregateMarkingString
    // Description: Marking string. entity name etc. max 31 octets/chars
    // Parameter:   const KCHAR8 * EMS, void
    // Parameter:   KUINT16 StringSize, void
    //************************************
    void SetAggregateMarkingString( const KCHAR8 * M, KUINT16 StringSize );
    KString GetAggregateMarkingString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateMarking::GetAsString
    // Description: Returns a string representation
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateMarking::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AggregateMarking::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const AggregateMarking & Value ) const;
    KBOOL operator != ( const AggregateMarking & Value ) const;
}